

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[10],char_const*,char[4],char[18],unsigned_int,char[3],unsigned_int>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [10],char **RestArgs,char (*RestArgs_1) [4],char (*RestArgs_2) [18],
               uint *RestArgs_3,char (*RestArgs_4) [3],uint *RestArgs_5)

{
  uint *RestArgs_local_3;
  char (*RestArgs_local_2) [18];
  char (*RestArgs_local_1) [4];
  char **RestArgs_local;
  char (*FirstArg_local) [10];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[10]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[4],char[18],unsigned_int,char[3],unsigned_int>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}